

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivTransform(Gia_Man_t *p,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Rpr_t *pGVar5;
  bool bVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint local_50;
  
  pGVar5 = p->pReprs;
  if ((pGVar5 == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x5bb,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_01->pArray = piVar7;
  uVar2 = p->nObjs;
  if ((0 < (int)uVar2) && (pGVar8 = p->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    do {
      uVar10 = (uint)*(undefined8 *)pGVar8;
      if ((((~uVar10 & 0x9fffffff) == 0) || ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10)) &&
         ((uint)pGVar5[uVar9] < 0x40000000)) {
        __assert_fail("Gia_ObjColors(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x5c0,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
      }
      uVar9 = uVar9 + 1;
      pGVar8 = pGVar8 + 1;
    } while (uVar2 != uVar9);
  }
  uVar13 = 0;
  local_50 = 0;
  uVar15 = 0;
  uVar10 = 0;
  if (1 < (int)uVar2) {
    uVar10 = 0;
    uVar15 = 0;
    local_50 = 0;
    uVar13 = 0;
    uVar9 = (ulong)uVar2;
    do {
      uVar14 = uVar9 - 1;
      pGVar5 = p->pReprs;
      if (((~(uint)pGVar5[uVar9 - 1] & 0xfffffff) == 0) && (0 < p->pNexts[uVar14])) {
        p_00->nSize = 0;
        p_01->nSize = 0;
        if (((~(uint)pGVar5[uVar14] & 0xfffffff) != 0) || (p->pNexts[uVar14] < 1)) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x5c6,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
        }
        uVar10 = uVar10 + 1;
        uVar12 = uVar14 & 0xffffffff;
        do {
          Vec_IntPush(p_00,(int)uVar12);
          if ((uint)p->pReprs[uVar12] >> 0x1e == 3) {
            uVar13 = uVar13 + 1;
          }
          else {
            if ((uint)p->pReprs[uVar12] >> 0x1e == 0) {
              __assert_fail("Gia_ObjColors(p, iNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                            ,0x5ca,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
            }
            Vec_IntPush(p_01,(int)uVar12);
          }
          puVar1 = (uint *)(p->pNexts + uVar12);
          uVar12 = (ulong)*puVar1;
          uVar15 = uVar15 + 1;
        } while (0 < (int)*puVar1);
        iVar3 = p_00->nSize;
        if (0 < (long)iVar3) {
          piVar7 = p_00->pArray;
          lVar11 = 0;
          do {
            iVar4 = piVar7[lVar11];
            p->pReprs[iVar4] = (Gia_Rpr_t)((uint)p->pReprs[iVar4] & 0xefffffff);
            p->pReprs[iVar4] = (Gia_Rpr_t)((uint)p->pReprs[iVar4] & 0xdfffffff);
            p->pReprs[iVar4] = (Gia_Rpr_t)((uint)p->pReprs[iVar4] | 0xfffffff);
            p->pNexts[iVar4] = 0;
            lVar11 = lVar11 + 1;
          } while (iVar3 != lVar11);
        }
        if (p_01->nSize < 2) {
          local_50 = local_50 + 1;
        }
        else {
          Cec_ManSimClassCreate(p,p_01);
        }
      }
      bVar6 = 2 < (long)uVar9;
      uVar9 = uVar14;
    } while (bVar6);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (fVerbose == 0) {
    return;
  }
  Abc_Print(1,"Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n",
            (ulong)local_50,(ulong)uVar10,(ulong)uVar13,(ulong)uVar15);
  return;
}

Assistant:

void Gia_ManEquivTransform( Gia_Man_t * p, int fVerbose )
{
    extern void Cec_ManSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass );
    Vec_Int_t * vClass, * vClassNew;
    int iRepr, iNode, Ent, k;
    int nRemovedLits = 0, nRemovedClas = 0;
    int nTotalLits = 0, nTotalClas = 0;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts );
    vClass = Vec_IntAlloc( 100 );
    vClassNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
            assert( Gia_ObjColors(p, i) );
    Gia_ManForEachClassReverse( p, iRepr )
    {
        nTotalClas++;
        Vec_IntClear( vClass );
        Vec_IntClear( vClassNew );
        Gia_ClassForEachObj( p, iRepr, iNode )
        {
            nTotalLits++;
            Vec_IntPush( vClass, iNode );
            assert( Gia_ObjColors(p, iNode) );
            if ( Gia_ObjColors(p, iNode) != 3 )
                Vec_IntPush( vClassNew, iNode );
            else
                nRemovedLits++;
        }
        Vec_IntForEachEntry( vClass, Ent, k )
        {
            p->pReprs[Ent].fFailed = p->pReprs[Ent].fProved = 0;
            p->pReprs[Ent].iRepr = GIA_VOID;
            p->pNexts[Ent] = 0;
        }
        if ( Vec_IntSize(vClassNew) < 2 )
        {
            nRemovedClas++;
            continue;
        }
        Cec_ManSimClassCreate( p, vClassNew );
    }
    Vec_IntFree( vClass );
    Vec_IntFree( vClassNew );
    if ( fVerbose )
    Abc_Print( 1, "Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n",
        nRemovedClas, nTotalClas, nRemovedLits, nTotalLits );
}